

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_materialized_cte.hpp
# Opt level: O3

void __thiscall
duckdb::LogicalMaterializedCTE::~LogicalMaterializedCTE(LogicalMaterializedCTE *this)

{
  pointer pcVar1;
  
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalMaterializedCTE_024388c0;
  pcVar1 = (this->ctename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ctename).field_2) {
    operator_delete(pcVar1);
  }
  LogicalOperator::~LogicalOperator(&this->super_LogicalOperator);
  operator_delete(this);
  return;
}

Assistant:

explicit LogicalMaterializedCTE() : LogicalOperator(LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
	}